

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview_p.h
# Opt level: O2

void __thiscall
QColumnViewPreviewColumn::resizeEvent(QColumnViewPreviewColumn *this,QResizeEvent *event)

{
  QWidgetData *pQVar1;
  QSize QVar2;
  QWidget *pQVar3;
  QSize QVar4;
  QScrollBar *pQVar5;
  Representation w;
  
  pQVar3 = this->previewWidget;
  if (pQVar3 != (QWidget *)0x0) {
    QVar2 = QWidget::minimumSize(pQVar3);
    w.m_i = *(int *)(event + 0x10);
    if (*(int *)(event + 0x10) <= QVar2.wd.m_i.m_i) {
      w.m_i = QVar2.wd.m_i.m_i;
    }
    pQVar1 = this->previewWidget->data;
    QWidget::resize(pQVar3,w.m_i,((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1);
    pQVar3 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QVar2 = QWidget::size(pQVar3);
    QVar4 = QWidget::size(this->previewWidget);
    pQVar5 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar5->super_QAbstractSlider,0,QVar4.wd.m_i.m_i - QVar2.wd.m_i);
    pQVar5 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setPageStep(&pQVar5->super_QAbstractSlider,QVar2.wd.m_i.m_i);
    pQVar5 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar5->super_QAbstractSlider,0,QVar4.ht.m_i.m_i - QVar2.ht.m_i);
    pQVar5 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setPageStep(&pQVar5->super_QAbstractSlider,QVar2.ht.m_i.m_i);
    QAbstractScrollArea::resizeEvent((QAbstractScrollArea *)this,event);
    return;
  }
  return;
}

Assistant:

void resizeEvent(QResizeEvent * event) override{
        if (!previewWidget)
            return;
        previewWidget->resize(
                qMax(previewWidget->minimumWidth(), event->size().width()),
                previewWidget->height());
        QSize p = viewport()->size();
        QSize v = previewWidget->size();
        horizontalScrollBar()->setRange(0, v.width() - p.width());
        horizontalScrollBar()->setPageStep(p.width());
        verticalScrollBar()->setRange(0, v.height() - p.height());
        verticalScrollBar()->setPageStep(p.height());

        QAbstractScrollArea::resizeEvent(event);
    }